

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QMidiBuffer.cpp
# Opt level: O2

bool __thiscall QMidiBuffer::requestSpace(QMidiBuffer *this,quint32 eventLength)

{
  uint uVar1;
  undefined4 *puVar2;
  
  puVar2 = (undefined4 *)this->writePointer;
  if (puVar2 == (undefined4 *)0x0) {
    puVar2 = (undefined4 *)
             Utility::QRingBuffer::writePointer
                       (&this->ringBuffer,&this->bytesToWrite,&this->freeSpaceContiguous);
    this->writePointer = puVar2;
  }
  while( true ) {
    uVar1 = this->bytesToWrite;
    if ((ulong)eventLength + 4 <= (ulong)uVar1) {
      return true;
    }
    if (this->freeSpaceContiguous == true) break;
    *puVar2 = 2;
    this->bytesWritten = this->bytesWritten + uVar1;
    flush(this);
    puVar2 = (undefined4 *)
             Utility::QRingBuffer::writePointer
                       (&this->ringBuffer,&this->bytesToWrite,&this->freeSpaceContiguous);
    this->writePointer = puVar2;
  }
  return eventLength <= uVar1;
}

Assistant:

bool QMidiBuffer::requestSpace(quint32 eventLength) {
	if (writePointer == NULL) {
		writePointer = ringBuffer.writePointer(bytesToWrite, freeSpaceContiguous);
	}
	while (bytesToWrite < (eventLength + sizeof(MidiEventHeader))) {
		if (freeSpaceContiguous) return eventLength <= bytesToWrite;
		// When the free space isn't contiguous, pad the rest of the ring buffer
		// and restart from the beginning.
		MidiEventHeader *padHeader = static_cast<MidiEventHeader *>(writePointer);
		padHeader->eventType = MidiEventLayout::MidiEventType_PAD;
		bytesWritten += bytesToWrite;
		flush();
		writePointer = ringBuffer.writePointer(bytesToWrite, freeSpaceContiguous);
	}
	return true;
}